

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FS.cpp
# Opt level: O3

ssize_t File::read(int __fd,void *__buf,size_t __nbytes)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  char cVar3;
  istream *piVar4;
  bool bVar5;
  undefined4 in_register_0000003c;
  __string_type __str;
  string line;
  ifstream in;
  string local_278;
  string local_258;
  long local_238 [4];
  int aiStack_218 [122];
  
  std::__cxx11::string::_M_replace((ulong)__buf,0,*(char **)((long)__buf + 8),0x17c5dc);
  std::ifstream::ifstream((istream *)local_238,*(char **)CONCAT44(in_register_0000003c,__fd),_S_in);
  iVar2 = *(int *)((long)aiStack_218 + *(long *)(local_238[0] + -0x18));
  if (iVar2 == 0) {
    local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
    local_258._M_string_length = 0;
    local_258.field_2._M_local_buf[0] = '\0';
    std::__cxx11::string::reserve((ulong)&local_258);
    paVar1 = &local_278.field_2;
    bVar5 = true;
    while( true ) {
      cVar3 = std::ios::widen((char)*(undefined8 *)(local_238[0] + -0x18) +
                              (char)(istream *)local_238);
      piVar4 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)local_238,(string *)&local_258,cVar3);
      if (((byte)piVar4[*(long *)(*(long *)piVar4 + -0x18) + 0x20] & 5) != 0) break;
      if (bVar5) {
        removeBOM(&local_278,&local_258);
        std::__cxx11::string::operator=((string *)&local_258,(string *)&local_278);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_278._M_dataplus._M_p != paVar1) {
          operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
        }
      }
      local_278._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_278,local_258._M_dataplus._M_p,
                 local_258._M_dataplus._M_p + local_258._M_string_length);
      std::__cxx11::string::_M_replace_aux((ulong)&local_278,local_278._M_string_length,0,'\x01');
      std::__cxx11::string::_M_append((char *)__buf,(ulong)local_278._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_278._M_dataplus._M_p != paVar1) {
        operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
      }
      bVar5 = false;
    }
    std::ifstream::close();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_dataplus._M_p != &local_258.field_2) {
      operator_delete(local_258._M_dataplus._M_p,
                      CONCAT71(local_258.field_2._M_allocated_capacity._1_7_,
                               local_258.field_2._M_local_buf[0]) + 1);
    }
  }
  std::ifstream::~ifstream(local_238);
  return CONCAT71((int7)((ulong)__buf >> 8),iVar2 == 0) & 0xffffffff;
}

Assistant:

bool File::read (const std::string& name, std::string& contents)
{
  contents = "";

  std::ifstream in (name.c_str ());
  if (in.good ())
  {
    bool first = true;
    std::string line;
    line.reserve (1024);
    while (getline (in, line))
    {
      // Detect forbidden BOM on first line.
      if (first)
      {
        line = File::removeBOM (line);
        first = false;
      }

      contents += line + '\n';
    }

    in.close ();
    return true;
  }

  return false;
}